

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request.c
# Opt level: O0

ngx_int_t ngx_http_process_request_uri(ngx_http_request_t *r)

{
  u_char *puVar1;
  ngx_int_t nVar2;
  ngx_http_core_srv_conf_t *cscf;
  ngx_http_request_t *r_local;
  
  if (r->args_start == (u_char *)0x0) {
    (r->uri).len = (long)r->uri_end - (long)r->uri_start;
  }
  else {
    (r->uri).len = (size_t)(r->args_start + (-1 - (long)r->uri_start));
  }
  if (((*(ulong *)&r->field_0x460 >> 0x25 & 1) == 0) &&
     ((*(ulong *)&r->field_0x460 >> 0x26 & 1) == 0)) {
    (r->uri).data = r->uri_start;
  }
  else {
    puVar1 = (u_char *)ngx_pnalloc(r->pool,(r->uri).len + 1);
    (r->uri).data = puVar1;
    if ((r->uri).data == (u_char *)0x0) {
      ngx_http_close_request(r,500);
      return -1;
    }
    nVar2 = ngx_http_parse_complex_uri
                      (r,*(ngx_uint_t *)((long)r->srv_conf[ngx_http_core_module.ctx_index] + 0x78));
    if (nVar2 != 0) {
      (r->uri).len = 0;
      if (6 < r->connection->log->log_level) {
        ngx_log_error_core(7,r->connection->log,0,"client sent invalid request");
      }
      ngx_http_finalize_request(r,400);
      return -1;
    }
  }
  (r->unparsed_uri).len = (long)r->uri_end - (long)r->uri_start;
  (r->unparsed_uri).data = r->uri_start;
  *(ulong *)&r->field_0x460 =
       *(ulong *)&r->field_0x460 & 0xffffefffffffffff |
       (ulong)(((uint)((ulong)*(undefined8 *)&r->field_0x460 >> 0x28) & 1) == 0) << 0x2c;
  if (r->uri_ext != (u_char *)0x0) {
    if (r->args_start == (u_char *)0x0) {
      (r->exten).len = (long)r->uri_end - (long)r->uri_ext;
    }
    else {
      (r->exten).len = (size_t)(r->args_start + (-1 - (long)r->uri_ext));
    }
    (r->exten).data = r->uri_ext;
  }
  if ((r->args_start != (u_char *)0x0) && (r->args_start < r->uri_end)) {
    (r->args).len = (long)r->uri_end - (long)r->args_start;
    (r->args).data = r->args_start;
  }
  if ((r->connection->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,r->connection->log,0,"http uri: \"%V\"",&r->uri);
  }
  if ((r->connection->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,r->connection->log,0,"http args: \"%V\"",&r->args);
  }
  if ((r->connection->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,r->connection->log,0,"http exten: \"%V\"",&r->exten);
  }
  return 0;
}

Assistant:

ngx_int_t
ngx_http_process_request_uri(ngx_http_request_t *r)
{
    ngx_http_core_srv_conf_t  *cscf;

    if (r->args_start) {
        r->uri.len = r->args_start - 1 - r->uri_start;
    } else {
        r->uri.len = r->uri_end - r->uri_start;
    }

    if (r->complex_uri || r->quoted_uri) {

        r->uri.data = ngx_pnalloc(r->pool, r->uri.len + 1);
        if (r->uri.data == NULL) {
            ngx_http_close_request(r, NGX_HTTP_INTERNAL_SERVER_ERROR);
            return NGX_ERROR;
        }

        cscf = ngx_http_get_module_srv_conf(r, ngx_http_core_module);

        if (ngx_http_parse_complex_uri(r, cscf->merge_slashes) != NGX_OK) {
            r->uri.len = 0;

            ngx_log_error(NGX_LOG_INFO, r->connection->log, 0,
                          "client sent invalid request");
            ngx_http_finalize_request(r, NGX_HTTP_BAD_REQUEST);
            return NGX_ERROR;
        }

    } else {
        r->uri.data = r->uri_start;
    }

    r->unparsed_uri.len = r->uri_end - r->uri_start;
    r->unparsed_uri.data = r->uri_start;

    r->valid_unparsed_uri = r->space_in_uri ? 0 : 1;

    if (r->uri_ext) {
        if (r->args_start) {
            r->exten.len = r->args_start - 1 - r->uri_ext;
        } else {
            r->exten.len = r->uri_end - r->uri_ext;
        }

        r->exten.data = r->uri_ext;
    }

    if (r->args_start && r->uri_end > r->args_start) {
        r->args.len = r->uri_end - r->args_start;
        r->args.data = r->args_start;
    }

#if (NGX_WIN32)
    {
    u_char  *p, *last;

    p = r->uri.data;
    last = r->uri.data + r->uri.len;

    while (p < last) {

        if (*p++ == ':') {

            /*
             * this check covers "::$data", "::$index_allocation" and
             * ":$i30:$index_allocation"
             */

            if (p < last && *p == '$') {
                ngx_log_error(NGX_LOG_INFO, r->connection->log, 0,
                              "client sent unsafe win32 URI");
                ngx_http_finalize_request(r, NGX_HTTP_BAD_REQUEST);
                return NGX_ERROR;
            }
        }
    }

    p = r->uri.data + r->uri.len - 1;

    while (p > r->uri.data) {

        if (*p == ' ') {
            p--;
            continue;
        }

        if (*p == '.') {
            p--;
            continue;
        }

        break;
    }

    if (p != r->uri.data + r->uri.len - 1) {
        r->uri.len = p + 1 - r->uri.data;
        ngx_http_set_exten(r);
    }

    }
#endif

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http uri: \"%V\"", &r->uri);

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http args: \"%V\"", &r->args);

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http exten: \"%V\"", &r->exten);

    return NGX_OK;
}